

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_AppStoreReceipt.cpp
# Opt level: O2

char * __thiscall
axl::cry::AppStoreReceiptPayloadParser::decode
          (AppStoreReceiptPayloadParser *this,State state,int expectedTag,char *unexpectedTagError,
          char *p,size_t size)

{
  EVP_PKEY_CTX *pEVar1;
  AttributeId AVar2;
  AppStoreReceipt *pAVar3;
  int iVar4;
  uint64_t uVar5;
  AppStoreIap *this_00;
  Iterator IVar6;
  char *unexpectedTagError_00;
  ulong count;
  State state_00;
  long lVar7;
  EVP_PKEY_CTX *pEVar8;
  EVP_PKEY_CTX *local_68;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_60;
  int tag;
  long length;
  int cls;
  
  local_68 = (EVP_PKEY_CTX *)p;
  iVar4 = ASN1_get_object((uchar **)&local_68,&length,&tag,&cls,size);
  if ((char)iVar4 < '\0') {
    setLastCryptoError();
    goto LAB_00124979;
  }
  if (tag != expectedTag) {
    err::ErrorRef::ErrorRef((ErrorRef *)&local_60,unexpectedTagError);
    err::setError((ErrorRef *)&local_60);
    goto LAB_0012496f;
  }
  pEVar1 = local_68 + length;
  pEVar8 = pEVar1;
  switch(state) {
  case State_Set:
    pEVar8 = (EVP_PKEY_CTX *)0x0;
    do {
      if (pEVar1 <= local_68) {
        return (char *)pEVar1;
      }
      local_68 = (EVP_PKEY_CTX *)
                 decode(this,State_Attribute,0x10,
                        "invalid app receipt attribute (expected ASN1 SEQUENCE)",(char *)local_68,
                        (long)pEVar1 - (long)local_68);
    } while (local_68 != (EVP_PKEY_CTX *)0x0);
    break;
  case State_Attribute:
    this->m_attributeId = AttributeId_Undefined;
    this->m_attributeString = (String *)0x0;
    this->m_attributeInteger = &this->m_attributeId;
    this->m_attributeIntegerSize = 4;
    local_68 = (EVP_PKEY_CTX *)
               decode(this,State_AttributeIntegerValue,2,
                      "invalid app receipt attribute type (expected ASN1 INTEGER)",(char *)local_68,
                      length);
    if (local_68 != (EVP_PKEY_CTX *)0x0) {
      this->m_attributeInteger = (void *)0x0;
      local_68 = (EVP_PKEY_CTX *)
                 decode(this,State_AttributeIntegerValue,2,
                        "invalid app receipt attribute version (expected ASN1 INTEGER)",
                        (char *)local_68,(long)pEVar1 - (long)local_68);
      if (local_68 == (EVP_PKEY_CTX *)0x0) goto LAB_00124979;
      length = (long)pEVar1 - (long)local_68;
      unexpectedTagError_00 = "invalid app receipt attribute value (expected ASN1 OCTET STRING)";
      state_00 = State_AttributeValue;
      iVar4 = 4;
LAB_00124d63:
      local_68 = (EVP_PKEY_CTX *)
                 decode(this,state_00,iVar4,unexpectedTagError_00,(char *)local_68,length);
      goto LAB_00124d68;
    }
    goto LAB_00124979;
  case State_AttributeValue:
    AVar2 = this->m_attributeId;
    switch(AVar2) {
    case AttributeId_IapQuantity:
      if (this->m_iap != (AppStoreIap *)0x0) {
        this->m_attributeInteger = &this->m_iap->m_quantity;
        this->m_attributeIntegerSize = 8;
        unexpectedTagError_00 = "invalid app receipt IAP quantity (expected ASN1 INTEGER)";
LAB_00124c8d:
        state_00 = State_AttributeIntegerValue;
        iVar4 = 2;
        goto LAB_00124d63;
      }
      err::ErrorRef::ErrorRef((ErrorRef *)&local_60,"unexpected IAP attribute in app receipt");
      err::setError((ErrorRef *)&local_60);
      break;
    case AttributeId_IapProductId:
      if (this->m_iap != (AppStoreIap *)0x0) {
        this->m_attributeString = &this->m_iap->m_productId;
        unexpectedTagError_00 = "invalid app receipt IAP product ID (expected ASN1 UTF8 STRING)";
        goto LAB_00124d57;
      }
      err::ErrorRef::ErrorRef((ErrorRef *)&local_60,"unexpected IAP attribute in app receipt");
      err::setError((ErrorRef *)&local_60);
      break;
    case AttributeId_IapTransactionId:
      if (this->m_iap != (AppStoreIap *)0x0) {
        this->m_attributeString = &this->m_iap->m_transactionId;
        unexpectedTagError_00 = "invalid app receipt IAP transaction ID (expected ASN1 UTF8 STRING)"
        ;
        goto LAB_00124d57;
      }
      err::ErrorRef::ErrorRef((ErrorRef *)&local_60,"unexpected IAP attribute in app receipt");
      err::setError((ErrorRef *)&local_60);
      break;
    case AttributeId_IapPurchaseDate:
      if (this->m_iap != (AppStoreIap *)0x0) {
        this->m_attributeString = &this->m_iap->m_purchaseDateString;
        local_68 = (EVP_PKEY_CTX *)
                   decode(this,State_AttributeStringValue,0x16,
                          "invalid app receipt IAP purchase date (expected ASN1 IA5 STRING)",
                          (char *)local_68,length);
        uVar5 = decodeRfc3339Timestamp
                          (&(this->m_iap->m_purchaseDateString).
                            super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
        this->m_iap->m_purchaseTimestamp = uVar5;
        goto switchD_001249d3_caseD_6ab;
      }
      err::ErrorRef::ErrorRef((ErrorRef *)&local_60,"unexpected IAP attribute in app receipt");
      err::setError((ErrorRef *)&local_60);
      break;
    case AttributeId_IapOriginalTransactionId:
      if (this->m_iap != (AppStoreIap *)0x0) {
        this->m_attributeString = &this->m_iap->m_originalTransactionId;
        unexpectedTagError_00 =
             "invalid app receipt IAP original transaction ID (expected ASN1 UTF8 STRING)";
        goto LAB_00124d57;
      }
      err::ErrorRef::ErrorRef((ErrorRef *)&local_60,"unexpected IAP attribute in app receipt");
      err::setError((ErrorRef *)&local_60);
      break;
    case AttributeId_IapOriginalPurchaseDate:
      if (this->m_iap != (AppStoreIap *)0x0) {
        this->m_attributeString = &this->m_iap->m_originalPurchaseDateString;
        local_68 = (EVP_PKEY_CTX *)
                   decode(this,State_AttributeStringValue,0x16,
                          "invalid app receipt IAP original purchase date (expected ASN1 IA5 STRING)"
                          ,(char *)local_68,length);
        uVar5 = decodeRfc3339Timestamp
                          (&(this->m_iap->m_originalPurchaseDateString).
                            super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
        this->m_iap->m_originalPurchaseTimestamp = uVar5;
        goto switchD_001249d3_caseD_6ab;
      }
      err::ErrorRef::ErrorRef((ErrorRef *)&local_60,"unexpected IAP attribute in app receipt");
      err::setError((ErrorRef *)&local_60);
      break;
    case 0x6ab:
    case 0x6ad:
    case AttributeId_IapSubscriptionExpirationDate|AttributeId_BundleId:
      goto switchD_001249d3_caseD_6ab;
    case AttributeId_IapSubscriptionExpirationDate:
      if (this->m_iap != (AppStoreIap *)0x0) {
        this->m_attributeString = &this->m_iap->m_subscriptionExpirationDateString;
        local_68 = (EVP_PKEY_CTX *)
                   decode(this,State_AttributeStringValue,0x16,
                          "invalid app receipt IAP subscription expiration date (expected ASN1 IA5 STRING)"
                          ,(char *)local_68,length);
        uVar5 = decodeRfc3339Timestamp
                          (&(this->m_iap->m_subscriptionExpirationDateString).
                            super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
        this->m_iap->m_subscriptionExpirationTimestamp = uVar5;
        goto switchD_001249d3_caseD_6ab;
      }
      err::ErrorRef::ErrorRef((ErrorRef *)&local_60,"unexpected IAP attribute in app receipt");
      err::setError((ErrorRef *)&local_60);
      break;
    case AttributeId_IapWebOrderLineItemId:
      if (this->m_iap != (AppStoreIap *)0x0) {
        this->m_attributeInteger = &this->m_iap->m_webOrderLineItemId;
        this->m_attributeIntegerSize = 4;
        unexpectedTagError_00 =
             "invalid app receipt IAP web order line item ID (expected ASN1 INTEGER)";
        goto LAB_00124c8d;
      }
      err::ErrorRef::ErrorRef((ErrorRef *)&local_60,"unexpected IAP attribute in app receipt");
      err::setError((ErrorRef *)&local_60);
      break;
    case AttributeId_IapCancellationDate:
      if (this->m_iap != (AppStoreIap *)0x0) {
        this->m_attributeString = &this->m_iap->m_cancellationDateString;
        local_68 = (EVP_PKEY_CTX *)
                   decode(this,State_AttributeStringValue,0x16,
                          "invalid app receipt IAP purchase date (expected ASN1 IA5 STRING)",
                          (char *)local_68,length);
        uVar5 = decodeRfc3339Timestamp
                          (&(this->m_iap->m_cancellationDateString).
                            super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
        this->m_iap->m_cancellationTimestamp = uVar5;
        goto switchD_001249d3_caseD_6ab;
      }
      err::ErrorRef::ErrorRef((ErrorRef *)&local_60,"unexpected IAP attribute in app receipt");
      err::setError((ErrorRef *)&local_60);
      break;
    default:
      switch(AVar2) {
      case AttributeId_BundleId:
        sl::Array<char,_axl::sl::ArrayDetails<char>_>::copy
                  (&this->m_receipt->m_rawBundleId,local_68,(EVP_PKEY_CTX *)length);
        this->m_attributeString = &this->m_receipt->m_bundleId;
        unexpectedTagError_00 = "invalid app receipt bundle ID (expected ASN1 UTF8 STRING)";
        state_00 = State_AttributeStringValue;
        iVar4 = 0xc;
        goto LAB_00124d63;
      case AttributeId_AppVersion:
        this->m_attributeString = &this->m_receipt->m_appVersion;
        unexpectedTagError_00 = "invalid app receipt version (expected ASN1 UTF8 STRING)";
LAB_00124d57:
        state_00 = State_AttributeStringValue;
        iVar4 = 0xc;
        goto LAB_00124d63;
      case AttributeId_Opaque:
        lVar7 = 200;
        goto LAB_00124d31;
      case AttributeId_Sha1Hash:
        lVar7 = 0xe0;
LAB_00124d31:
        sl::Array<char,_axl::sl::ArrayDetails<char>_>::copy
                  ((Array<char,_axl::sl::ArrayDetails<char>_> *)
                   ((long)&(this->m_receipt->m_bundleId).
                           super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>.m_p + lVar7)
                   ,local_68,(EVP_PKEY_CTX *)length);
        break;
      case AttributeId_Opaque|AttributeId_BundleId:
      case AttributeId_Opaque|AttributeId_AppVersion:
      case 8:
      case 9:
      case 10:
      case 0xb:
        break;
      case AttributeId_ReceiptCreationDate:
        this->m_attributeString = &this->m_receipt->m_receiptCreationDateString;
        local_68 = (EVP_PKEY_CTX *)
                   decode(this,State_AttributeStringValue,0x16,
                          "invalid app receipt creation date (expected ASN1 IA5 STRING)",
                          (char *)local_68,length);
        uVar5 = decodeRfc3339Timestamp
                          (&(this->m_receipt->m_receiptCreationDateString).
                            super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
        this->m_receipt->m_receiptCreationTimestamp = uVar5;
        break;
      default:
        if (AVar2 != AttributeId_Iap) {
          if (AVar2 != AttributeId_OriginalAppVersion) break;
          this->m_attributeString = &this->m_receipt->m_originalAppVersion;
          unexpectedTagError_00 = "invalid app receipt original version (expected ASN1 UTF8 STRING)"
          ;
          goto LAB_00124d57;
        }
        pAVar3 = this->m_receipt;
        this_00 = (AppStoreIap *)operator_new(0x120);
        AppStoreIap::AppStoreIap(this_00);
        IVar6 = sl::
                ListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>_>
                ::insertTail((ListBase<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>,_axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>_>
                              *)&pAVar3->m_iapList,this_00);
        this->m_iap = (AppStoreIap *)
                      IVar6.
                      super_IteratorImpl<axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::cry::AppStoreIap,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>
                      .
                      super_IteratorBase<axl::sl::Iterator<axl::cry::AppStoreIap,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>,_axl::cry::AppStoreIap,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::cry::AppStoreIap,_axl::sl::ListLink>_>
                      .m_p;
        local_68 = (EVP_PKEY_CTX *)
                   decode(this,State_Set,0x11,"invalid app receipt IAP (expected ASN1 SET)",
                          (char *)local_68,(long)pEVar1 - (long)local_68);
        this->m_iap = (AppStoreIap *)0x0;
        goto LAB_00124d68;
      }
switchD_001249d3_caseD_6ab:
LAB_00124d68:
      if (local_68 != (EVP_PKEY_CTX *)0x0) {
        return (char *)pEVar1;
      }
      goto LAB_00124979;
    }
LAB_0012496f:
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&local_60);
LAB_00124979:
    pEVar8 = (EVP_PKEY_CTX *)0x0;
    break;
  case State_AttributeStringValue:
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
              (this->m_attributeString,local_68,(EVP_PKEY_CTX *)length);
    break;
  case State_AttributeIntegerValue:
    if ((char *)this->m_attributeInteger != (char *)0x0) {
      count = this->m_attributeIntegerSize;
      if ((ulong)length < this->m_attributeIntegerSize) {
        count = length;
      }
      sl::ReverseArray<char>::copyReverse((char *)this->m_attributeInteger,(char *)local_68,count);
    }
  }
  return (char *)pEVar8;
}

Assistant:

const char*
AppStoreReceiptPayloadParser::decode(
	State state,
	int expectedTag,
	const char* unexpectedTagError,
	const char* p,
	size_t size
) {
	ASSERT(m_receipt);

	long length;
	int tag;
	int cls;

	int retCode = ASN1_get_object((const uchar_t**)&p, &length, &tag, &cls, size);
	if (retCode & 0x80)
		return failWithLastCryptoError<const char*>(NULL);

	if (tag != expectedTag)
		return err::fail<const char*>(NULL, unexpectedTagError);

	const char* end = p + length;

	switch (state) {
	case State_Set:
		while (p < end) {
			p = decode(
				State_Attribute,
				V_ASN1_SEQUENCE,
				"invalid app receipt attribute (expected ASN1 SEQUENCE)",
				p,
				end - p
			);

			if (!p)
				return NULL;
		}

		break;

	case State_Attribute:
		m_attributeId = AttributeId_Undefined;
		m_attributeString = NULL;
		m_attributeInteger = &m_attributeId;
		m_attributeIntegerSize = sizeof(m_attributeId);

		p = decode(
			State_AttributeIntegerValue,
			V_ASN1_INTEGER,
			"invalid app receipt attribute type (expected ASN1 INTEGER)",
			p,
			end - p
		);

		if (!p)
			return NULL;

		m_attributeInteger = NULL; // ignore attribute version value

		p = decode(
			State_AttributeIntegerValue,
			V_ASN1_INTEGER,
			"invalid app receipt attribute version (expected ASN1 INTEGER)",
			p,
			end - p
		);

		if (!p)
			return NULL;

		p = decode(
			State_AttributeValue,
			V_ASN1_OCTET_STRING,
			"invalid app receipt attribute value (expected ASN1 OCTET STRING)",
			p,
			end - p
		);

		if (!p)
			return NULL;

		break;

	case State_AttributeValue:
		switch (m_attributeId) {
		case AttributeId_BundleId:
			m_receipt->m_rawBundleId.copy(p, length);
			m_attributeString = &m_receipt->m_bundleId;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt bundle ID (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_AppVersion:
			m_attributeString = &m_receipt->m_appVersion;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt version (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_OriginalAppVersion:
			m_attributeString = &m_receipt->m_originalAppVersion;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt original version (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_ReceiptCreationDate:
			m_attributeString = &m_receipt->m_receiptCreationDateString;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_IA5STRING,
				"invalid app receipt creation date (expected ASN1 IA5 STRING)",
				p,
				length
			);

			m_receipt->m_receiptCreationTimestamp = decodeRfc3339Timestamp(m_receipt->m_receiptCreationDateString);
			break;

		case AttributeId_Iap:
			m_iap = *m_receipt->m_iapList.insertTail(new AppStoreIap);

			p = decode(
				State_Set,
				V_ASN1_SET,
				"invalid app receipt IAP (expected ASN1 SET)",
				p,
				end - p
			);

			m_iap = NULL;
			break;

		case AttributeId_Opaque:
			m_receipt->m_opaque.copy(p, length);
			break;

		case AttributeId_Sha1Hash:
			m_receipt->m_sha1Hash.copy(p, length);
			break;

		case AttributeId_IapQuantity:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeInteger = &m_iap->m_quantity;
			m_attributeIntegerSize = sizeof(m_iap->m_quantity);

			p = decode(
				State_AttributeIntegerValue,
				V_ASN1_INTEGER,
				"invalid app receipt IAP quantity (expected ASN1 INTEGER)",
				p,
				length
			);
			break;

		case AttributeId_IapProductId:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_productId;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt IAP product ID (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_IapTransactionId:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_transactionId;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt IAP transaction ID (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_IapPurchaseDate:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_purchaseDateString;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_IA5STRING,
				"invalid app receipt IAP purchase date (expected ASN1 IA5 STRING)",
				p,
				length
			);

			m_iap->m_purchaseTimestamp = decodeRfc3339Timestamp(m_iap->m_purchaseDateString);
			break;

		case AttributeId_IapOriginalTransactionId:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_originalTransactionId;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_UTF8STRING,
				"invalid app receipt IAP original transaction ID (expected ASN1 UTF8 STRING)",
				p,
				length
			);

			break;

		case AttributeId_IapOriginalPurchaseDate:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_originalPurchaseDateString;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_IA5STRING,
				"invalid app receipt IAP original purchase date (expected ASN1 IA5 STRING)",
				p,
				length
			);

			m_iap->m_originalPurchaseTimestamp = decodeRfc3339Timestamp(m_iap->m_originalPurchaseDateString);
			break;

		case AttributeId_IapSubscriptionExpirationDate:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_subscriptionExpirationDateString;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_IA5STRING,
				"invalid app receipt IAP subscription expiration date (expected ASN1 IA5 STRING)",
				p,
				length
			);

			m_iap->m_subscriptionExpirationTimestamp = decodeRfc3339Timestamp(m_iap->m_subscriptionExpirationDateString);
			break;

		case AttributeId_IapWebOrderLineItemId:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeInteger = &m_iap->m_webOrderLineItemId;
			m_attributeIntegerSize = sizeof(m_iap->m_webOrderLineItemId);

			p = decode(
				State_AttributeIntegerValue,
				V_ASN1_INTEGER,
				"invalid app receipt IAP web order line item ID (expected ASN1 INTEGER)",
				p,
				length
			);

			break;

		case AttributeId_IapCancellationDate:
			if (!m_iap)
				return err::fail<const char*>(NULL, "unexpected IAP attribute in app receipt");

			m_attributeString = &m_iap->m_cancellationDateString;

			p = decode(
				State_AttributeStringValue,
				V_ASN1_IA5STRING,
				"invalid app receipt IAP purchase date (expected ASN1 IA5 STRING)",
				p,
				length
			);

			m_iap->m_cancellationTimestamp = decodeRfc3339Timestamp(m_iap->m_cancellationDateString);
			break;

		default:
			AXL_TRACE("WARNING: unsupported AppStore Receipt attribute ID: 0x%x\n", m_attributeId);
		}

		if (!p)
			return NULL;

		break;

	case State_AttributeStringValue:
		ASSERT(m_attributeString);
		m_attributeString->copy(p, length);
		break;

	case State_AttributeIntegerValue:
		if (m_attributeInteger) {
			size_t size = AXL_MIN((size_t)length, m_attributeIntegerSize);
			sl::ArrayDetails<char>::copyReverse((char*)m_attributeInteger, p, size); // big-endian
		}

		break;

	default:
		ASSERT(false);
	}

	return end;
}